

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O1

NormalizationResult * __thiscall
Kernel::normalizeAdd<Kernel::NumTraits<Kernel::IntegerConstantType>>
          (NormalizationResult *__return_storage_ptr__,Kernel *this,NormalizationResult *lhs,
          NormalizationResult *rhs)

{
  char *pcVar1;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this_00;
  IntegerConstantType *pIVar2;
  byte bVar3;
  ulong uVar4;
  byte bVar5;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *l;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar6;
  RefIterator it;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> summands;
  RenderMonom local_e9;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_e8;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_c8;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_a8;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_88;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_68;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_48;
  
  bVar3 = (byte)*this & 7;
  if ((bVar3 == 4) &&
     ((undefined1  [52])
      ((undefined1  [52])
       (lhs->_inner).
       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
       .
       super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      & (undefined1  [52])0x7) == (undefined1  [52])0x1)) {
    RenderMonom::operator()
              (&local_48,(RenderMonom *)&local_e8,
               (PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)(this + 1));
    if (*(long *)((lhs->_inner).
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  .
                  super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                  ._content + 0x10) ==
        *(long *)((lhs->_inner).
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  .
                  super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                  ._content + 0x18)) {
      ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::expand
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
                 (lhs->_inner).
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                 .
                 super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                 ._content);
    }
    pIVar2 = *(IntegerConstantType **)
              ((lhs->_inner).
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
               .
               super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
               ._content + 0x10);
    IntegerConstantType::IntegerConstantType(pIVar2,&local_48.numeral);
    pIVar2[1]._val[0]._mp_alloc = local_48.factors._id;
    pIVar2[1]._val[0]._mp_d = (mp_limb_t *)local_48.factors._ptr;
    pcVar1 = (lhs->_inner).
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             .
             super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             ._content + 0x10;
    *(long *)pcVar1 = *(long *)pcVar1 + 0x20;
    mpz_clear((__mpz_struct *)&local_48);
  }
  else {
    bVar5 = *(byte *)&(lhs->_inner).
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      .
                      super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
            & 7 ^ 4;
    if (bVar3 == 1 && bVar5 == 0) {
      RenderMonom::operator()
                (&local_68,(RenderMonom *)&local_e8,
                 (PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                 (lhs->_inner).
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                 .
                 super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                 ._content);
      if (*(long *)(this + 0x11) == *(long *)(this + 0x19)) {
        ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::expand
                  ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
                   (this + 1));
      }
      pIVar2 = *(IntegerConstantType **)(this + 0x11);
      IntegerConstantType::IntegerConstantType(pIVar2,&local_68.numeral);
      pIVar2[1]._val[0]._mp_alloc = local_68.factors._id;
      pIVar2[1]._val[0]._mp_d = (mp_limb_t *)local_68.factors._ptr;
      *(long *)(this + 0x11) = *(long *)(this + 0x11) + 0x20;
      mpz_clear((__mpz_struct *)&local_68);
      lhs = (NormalizationResult *)this;
    }
    else {
      this_00 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)(this + 1)
      ;
      pcVar1 = (lhs->_inner).
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
               .
               super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
               ._content;
      if (bVar3 == 4 && bVar5 == 0) {
        local_e8._capacity = 2;
        local_e8._stack =
             (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
        local_e8._end = local_e8._stack + local_e8._capacity;
        local_e8._cursor = local_e8._stack;
        RenderMonom::operator()
                  (&local_88,&local_e9,
                   (PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)this_00);
        if (local_e8._cursor == local_e8._end) {
          ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::expand
                    (&local_e8);
        }
        pMVar6 = local_e8._cursor;
        IntegerConstantType::IntegerConstantType(&(local_e8._cursor)->numeral,&local_88.numeral);
        (pMVar6->factors)._id = local_88.factors._id;
        (pMVar6->factors)._ptr = local_88.factors._ptr;
        local_e8._cursor = local_e8._cursor + 1;
        mpz_clear((__mpz_struct *)&local_88);
        RenderMonom::operator()
                  (&local_a8,&local_e9,
                   (PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)pcVar1);
        if (local_e8._cursor == local_e8._end) {
          ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::expand
                    (&local_e8);
        }
        pMVar6 = local_e8._cursor;
        IntegerConstantType::IntegerConstantType(&(local_e8._cursor)->numeral,&local_a8.numeral);
        (pMVar6->factors)._id = local_a8.factors._id;
        (pMVar6->factors)._ptr = local_a8.factors._ptr;
        local_e8._cursor = local_e8._cursor + 1;
        mpz_clear((__mpz_struct *)&local_a8);
        Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom(&local_c8,&local_e8);
        ::Lib::
        Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ::Coproduct<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_0>
                  (__return_storage_ptr__,&local_c8);
        while (local_c8._summands._cursor != local_c8._summands._stack) {
          local_c8._summands._cursor = local_c8._summands._cursor + -1;
          mpz_clear((__mpz_struct *)local_c8._summands._cursor);
        }
        pMVar6 = local_e8._cursor;
        if (local_c8._summands._stack !=
            (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
          uVar4 = local_c8._summands._capacity << 5;
          if (uVar4 == 0) {
            ((local_c8._summands._stack)->numeral)._val[0]._mp_alloc =
                 ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
            ((local_c8._summands._stack)->numeral)._val[0]._mp_size =
                 ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_c8._summands._stack;
          }
          else if (uVar4 < 0x21) {
            ((local_c8._summands._stack)->numeral)._val[0]._mp_alloc =
                 ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
            ((local_c8._summands._stack)->numeral)._val[0]._mp_size =
                 ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_c8._summands._stack;
          }
          else if (uVar4 < 0x31) {
            ((local_c8._summands._stack)->numeral)._val[0]._mp_alloc =
                 ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
            ((local_c8._summands._stack)->numeral)._val[0]._mp_size =
                 ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_c8._summands._stack;
          }
          else if (uVar4 < 0x41) {
            ((local_c8._summands._stack)->numeral)._val[0]._mp_alloc =
                 ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
            ((local_c8._summands._stack)->numeral)._val[0]._mp_size =
                 ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_c8._summands._stack;
          }
          else {
            operator_delete(local_c8._summands._stack,0x10);
            pMVar6 = local_e8._cursor;
          }
        }
        while (pMVar6 != local_e8._stack) {
          mpz_clear((__mpz_struct *)(pMVar6 + -1));
          pMVar6 = pMVar6 + -1;
        }
        if (local_e8._stack == (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
          return __return_storage_ptr__;
        }
        uVar4 = local_e8._capacity << 5;
        if (uVar4 == 0) {
          ((local_e8._stack)->numeral)._val[0]._mp_alloc =
               ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
          ((local_e8._stack)->numeral)._val[0]._mp_size =
               ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_e8._stack;
          return __return_storage_ptr__;
        }
        if (uVar4 < 0x21) {
          ((local_e8._stack)->numeral)._val[0]._mp_alloc =
               ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
          ((local_e8._stack)->numeral)._val[0]._mp_size =
               ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_e8._stack;
          return __return_storage_ptr__;
        }
        if (uVar4 < 0x31) {
          ((local_e8._stack)->numeral)._val[0]._mp_alloc =
               ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
          ((local_e8._stack)->numeral)._val[0]._mp_size =
               ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_e8._stack;
          return __return_storage_ptr__;
        }
        if (uVar4 < 0x41) {
          ((local_e8._stack)->numeral)._val[0]._mp_alloc =
               ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
          ((local_e8._stack)->numeral)._val[0]._mp_size =
               ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_e8._stack;
          return __return_storage_ptr__;
        }
        operator_delete(local_e8._stack,0x10);
        return __return_storage_ptr__;
      }
      ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::reserve
                (this_00,(*(long *)((lhs->_inner).
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                    .
                                    super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                    ._content + 0x10) -
                          *(long *)((lhs->_inner).
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                    .
                                    super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                    ._content + 8) >> 5) +
                         (*(long *)(this + 0x11) - *(long *)(this + 9) >> 5));
      it._stack = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)pcVar1;
      it._pointer = *(Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)
                     ((lhs->_inner).
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      .
                      super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      ._content + 0x10);
      ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>>::
      loadFromIterator<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>>::RefIterator>
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>> *)this_00,it)
      ;
      lhs = (NormalizationResult *)this;
    }
  }
  ::Lib::CoproductImpl::TrivialOperations::MoveCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  ::DefaultImpl(&__return_storage_ptr__->_inner,&lhs->_inner);
  return __return_storage_ptr__;
}

Assistant:

NormalizationResult normalizeAdd(NormalizationResult& lhs, NormalizationResult& rhs) {
  using Polynom = Polynom<NumTraits>;
  using Monom = Monom<NumTraits>;
  using PreMonom = PreMonom<NumTraits>;
  ASS(lhs.is<Polynom>() || lhs.is<PreMonom>())
  ASS(rhs.is<Polynom>() || rhs.is<PreMonom>())

  if (lhs.is<PreMonom>() && rhs.is<Polynom>())  {
    auto& l = lhs.unwrap<PreMonom>();
    auto& r = rhs.unwrap<Polynom>();
    /* Monom(...) + Polynom(x0, x1, ...) ==> Polynom(x0, x1, ..., Monom(...)) */
    r.raw().push(RenderMonom{}(std::move(l)));
    return std::move(rhs);

  } else if (rhs.is<PreMonom>() && lhs.is<Polynom>()){
    auto& r = rhs.unwrap<PreMonom>();
    auto& l = lhs.unwrap<Polynom>();

    /*  Polynom(x0, x1, ...) + Monom(...) ==> Polynom(x0, x1, ..., Monom(...)) */
    l.raw().push(RenderMonom{}(std::move(r)));
    return std::move(lhs);

  } else if (lhs.is<PreMonom>() && rhs.is<PreMonom>()) {
    auto& l = lhs.unwrap<PreMonom>();
    auto& r = rhs.unwrap<PreMonom>();

    /* Monom(x0, x1, ...) + Monom(y0, y1, ...) ==> Polynom(Monom(x0, x1, ...), Polynom(y0, y1, ...)) */
    Stack<Monom> summands(2);
    summands.push(RenderMonom{}(std::move(l)));
    summands.push(RenderMonom{}(std::move(r)));
    return NormalizationResult(Polynom(std::move(summands)));

  } else{
    ASS(lhs.is<Polynom>())
    ASS(rhs.is<Polynom>())
    auto& l = lhs.unwrap<Polynom>();
    auto& r = rhs.unwrap<Polynom>();

    /* Polynom(x0, x1, ...) + Polynom(y0, y1, ...) ==> Polynom(x0, x1, ..., y0, y1, ...) */
    l.raw().reserve(l.raw().size() + r.raw().size());
    l.raw().loadFromIterator(r.raw().iter());
    return std::move(lhs);
  }
}